

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::ExistingFileMatchesProto
               (FileDescriptor *existing_file,FileDescriptorProto *proto)

{
  bool bVar1;
  __type _Var2;
  Syntax SVar3;
  char *value;
  string local_140;
  string local_120;
  undefined1 local_f0 [8];
  FileDescriptorProto existing_proto;
  FileDescriptorProto *proto_local;
  FileDescriptor *existing_file_local;
  
  existing_proto.source_code_info_ = (SourceCodeInfo *)proto;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f0);
  FileDescriptor::CopyTo(existing_file,(FileDescriptorProto *)local_f0);
  SVar3 = FileDescriptor::syntax(existing_file);
  if ((SVar3 == SYNTAX_PROTO2) &&
     (bVar1 = FileDescriptorProto::has_syntax
                        ((FileDescriptorProto *)existing_proto.source_code_info_), bVar1)) {
    SVar3 = FileDescriptor::syntax(existing_file);
    value = FileDescriptor::SyntaxName(SVar3);
    FileDescriptorProto::set_syntax((FileDescriptorProto *)local_f0,value);
  }
  MessageLite::SerializeAsString_abi_cxx11_(&local_120,(MessageLite *)local_f0);
  MessageLite::SerializeAsString_abi_cxx11_
            (&local_140,(MessageLite *)existing_proto.source_code_info_);
  _Var2 = std::operator==(&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f0);
  return _Var2;
}

Assistant:

static bool ExistingFileMatchesProto(const FileDescriptor* existing_file,
                                     const FileDescriptorProto& proto) {
  FileDescriptorProto existing_proto;
  existing_file->CopyTo(&existing_proto);
  // TODO(liujisi): Remove it when CopyTo supports copying syntax params when
  // syntax="proto2".
  if (existing_file->syntax() == FileDescriptor::SYNTAX_PROTO2 &&
      proto.has_syntax()) {
    existing_proto.set_syntax(
        existing_file->SyntaxName(existing_file->syntax()));
  }

  return existing_proto.SerializeAsString() == proto.SerializeAsString();
}